

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

uint qvariant_cast<unsigned_int>(QVariant *v)

{
  PrivateShared *pPVar1;
  bool bVar2;
  uint uVar3;
  QMetaType QVar4;
  long in_FS_OFFSET;
  uint t;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr =
       (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<unsigned_int>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar2 = comparesEqual(&local_28,&local_20);
  if (bVar2) {
    if (((v->d).field_0x18 & 1) == 0) {
      uVar3 = *(uint *)&(v->d).data;
    }
    else {
      pPVar1 = (v->d).data.shared;
      uVar3 = *(uint *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
  }
  else {
    local_28.d_ptr = local_28.d_ptr & 0xffffffff00000000;
    QVar4.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    QMetaType::convert(QVar4,v,local_20,&local_28);
    uVar3 = (uint)local_28.d_ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}